

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qheaderview.cpp
# Opt level: O1

void __thiscall QHeaderViewPrivate::restoreSizeOnPrevLastSection(QHeaderViewPrivate *this)

{
  int logical;
  QHeaderView *this_00;
  
  logical = this->lastSectionLogicalIdx;
  if (-1 < logical) {
    this_00 = *(QHeaderView **)
               &(this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                super_QFramePrivate.super_QWidgetPrivate.field_0x8;
    this->lastSectionLogicalIdx = -1;
    QHeaderView::resizeSection(this_00,logical,this->lastSectionSize);
    return;
  }
  return;
}

Assistant:

void QHeaderViewPrivate::restoreSizeOnPrevLastSection()
{
    Q_Q(QHeaderView);
    if (lastSectionLogicalIdx < 0)
        return;
    int resizeLogIdx = lastSectionLogicalIdx;
    lastSectionLogicalIdx = -1; // We do not want resize to catch it as the last section.
    q->resizeSection(resizeLogIdx, lastSectionSize);
}